

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O2

FFSEncodeVector copy_all_to_FFSBuffer(FFSBuffer buf,FFSEncodeVector vec)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  long lVar5;
  ssize_t sVar6;
  FFSEncodeVector pFVar7;
  undefined8 uVar8;
  FFSEncodeVector pFVar9;
  size_t s;
  
  pvVar1 = buf->tmp_buffer;
  s = 0xfffffffffffffff8;
  do {
    lVar5 = s * 2;
    s = s + 8;
  } while (*(long *)((long)&vec[1].iov_base + lVar5) != 0);
  pvVar4 = ffs_malloc(s);
  for (lVar5 = 0; pvVar2 = *(void **)((long)&vec->iov_base + lVar5 * 2), pvVar2 != (void *)0x0;
      lVar5 = lVar5 + 8) {
    pvVar3 = buf->tmp_buffer;
    if ((pvVar2 < pvVar3) || ((void *)((long)pvVar3 + buf->tmp_buffer_size) <= pvVar2)) {
      uVar8 = 0;
    }
    else {
      *(long *)((long)&vec->iov_base + lVar5 * 2) = (long)pvVar2 + (1 - (long)pvVar3);
      uVar8 = 1;
    }
    *(undefined8 *)((long)pvVar4 + lVar5) = uVar8;
  }
  lVar5 = 0;
  while (*(long *)((long)vec + (long)buf->tmp_buffer + (lVar5 * 2 - (long)pvVar1)) != 0) {
    if (*(long *)((long)pvVar4 + lVar5) == 0) {
      sVar6 = add_to_tmp_buffer(buf,*(size_t *)
                                     ((long)vec +
                                     (long)buf->tmp_buffer + lVar5 * 2 + (8 - (long)pvVar1)));
      pvVar2 = buf->tmp_buffer;
      memcpy((void *)(sVar6 + (long)pvVar2),
             *(void **)((long)vec + (long)pvVar2 + (lVar5 * 2 - (long)pvVar1)),
             *(size_t *)((long)vec + (long)pvVar2 + lVar5 * 2 + (8 - (long)pvVar1)));
      *(ssize_t *)((long)vec + (long)pvVar2 + (lVar5 * 2 - (long)pvVar1)) = sVar6 + 1;
    }
    lVar5 = lVar5 + 8;
  }
  free(pvVar4);
  pvVar4 = buf->tmp_buffer;
  pFVar9 = (FFSEncodeVector)((long)vec + ((long)pvVar4 - (long)pvVar1));
  for (pFVar7 = pFVar9; pvVar1 = pFVar7->iov_base, pvVar1 != (void *)0x0; pFVar7 = pFVar7 + 1) {
    if ((0 < (long)pvVar1) && (pvVar1 <= (void *)buf->tmp_buffer_size)) {
      pFVar7->iov_base = (void *)((long)pvVar1 + (long)pvVar4 + -1);
    }
  }
  return pFVar9;
}

Assistant:

extern FFSEncodeVector
copy_all_to_FFSBuffer(FFSBuffer buf, FFSEncodeVector vec)
{
    int i = 0;
    intptr_t vec_offset = (intptr_t) vec - (intptr_t)buf->tmp_buffer;
    /* 
     * vec and some of the buffers may be in the memory managed by the
     * FFSBuffer.  The goal here to is put *everything* into the FFSBuffer.
     */
    int vec_count = 0;
    while (vec[vec_count].iov_base != NULL) {
      vec_count++;
    }
    assert(((uintptr_t)vec >= (uintptr_t)buf->tmp_buffer) && 
	   ((uintptr_t)vec < (uintptr_t)buf->tmp_buffer + buf->tmp_buffer_size));
    {
	size_t* already_in = malloc(sizeof(already_in[0]) * vec_count);
	while (vec[i].iov_base != NULL) {
	    if (((char*)vec[i].iov_base >= (char*)buf->tmp_buffer) &&
		((char*)vec[i].iov_base < (char*)buf->tmp_buffer + buf->tmp_buffer_size)) {
	        /* 
		 * remap pointers into temp so that they're offsets (must do
		 * this before we realloc the temp
		 */ 
	        vec[i].iov_base = (void*)((char *)vec[i].iov_base - (char *)buf->tmp_buffer + 1);
		already_in[i] = 1;
	    } else {
		already_in[i] = 0;
	    }
	    i++;
	}

	i = 0;
	while (((FFSEncodeVector)((intptr_t)buf->tmp_buffer + vec_offset))[i].iov_base !=
	       NULL) {
	    FFSEncodeVector v = (void*)((intptr_t) buf->tmp_buffer + vec_offset);
	    if (already_in[i] == 0) {
	        /* if this is an external buffer, copy it */
	        ssize_t offset = add_to_tmp_buffer(buf, v[i].iov_len);
		char * data = (char *) buf->tmp_buffer + offset;
		/* add_to_tmp_buffer() might have remapped vector */
		v = (void*)((char *) buf->tmp_buffer + vec_offset);
		memcpy(data, v[i].iov_base, v[i].iov_len);
		v[i].iov_base = (void*)(intptr_t)(offset + 1);
	    }
	    i++;
	}
	free(already_in);
    }
    /* reallocation done now */
    vec = (void*)((intptr_t)buf->tmp_buffer + vec_offset);
    i = 0;
    while (vec[i].iov_base != NULL) {
	if (((intptr_t)vec[i].iov_base > 0) &&
	    ((uintptr_t)vec[i].iov_base <= (uintptr_t)buf->tmp_buffer_size)) {
	    /* 
	     * remap pointers into temp so that they're addresses
	     */ 
	    vec[i].iov_base = (void*)((intptr_t)vec[i].iov_base + (char *)buf->tmp_buffer - 1);
	}
	i++;
    }
    return vec;
}